

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
ActionUnserialize::SerReadWriteMany<DataStream,int&,long&>
          (ActionUnserialize *this,DataStream *s,int *args,long *args_1)

{
  long in_FS_OFFSET;
  uint32_t obj;
  undefined4 local_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  DataStream::read((DataStream *)this,(int)&local_30,(void *)0x4,(size_t)args_1);
  *(undefined4 *)
   &(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = local_30;
  DataStream::read((DataStream *)this,(int)&local_30,&DAT_00000008,(size_t)args_1);
  *(ulong *)args = CONCAT44(uStack_2c,local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }